

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<void> __thiscall capnp::LocalRequest::sendStreaming(LocalRequest *this)

{
  Promise<capnp::Response<capnp::AnyPointer>_> node;
  PipelineHook *pPVar1;
  PipelineOp *pPVar2;
  size_t sVar3;
  LocalRequest *in_RSI;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_49;
  RemotePromise<capnp::AnyPointer> local_48;
  code *local_18;
  
  sendImpl(&local_48,in_RSI,true);
  local_18 = kj::_::
             SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h:260:68)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::Promise<capnp::Response<capnp::AnyPointer>>::ignoreResult()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_>,kj::_::PromiseDisposer,kj::Promise<capnp::Response<capnp::AnyPointer>>::ignoreResult()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,void*&>
            ((PromiseDisposer *)this,(OwnPromiseNode *)&local_48,&local_49,&local_18);
  sVar3 = local_48.super_Pipeline.ops.size_;
  pPVar2 = local_48.super_Pipeline.ops.ptr;
  if (local_48.super_Pipeline.ops.ptr != (PipelineOp *)0x0) {
    local_48.super_Pipeline.ops.ptr = (PipelineOp *)0x0;
    local_48.super_Pipeline.ops.size_ = 0;
    (*(code *)**(undefined8 **)local_48.super_Pipeline.ops.disposer)
              (local_48.super_Pipeline.ops.disposer,pPVar2,8,sVar3,sVar3,0);
  }
  pPVar1 = local_48.super_Pipeline.hook.ptr;
  if (local_48.super_Pipeline.hook.ptr != (PipelineHook *)0x0) {
    local_48.super_Pipeline.hook.ptr = (PipelineHook *)0x0;
    (**(local_48.super_Pipeline.hook.disposer)->_vptr_Disposer)
              (local_48.super_Pipeline.hook.disposer,
               pPVar1->_vptr_PipelineHook[-2] + (long)&pPVar1->_vptr_PipelineHook);
  }
  node.super_PromiseBase.node.ptr =
       (PromiseBase)(PromiseBase)local_48.super_Promise<capnp::Response<capnp::AnyPointer>_>;
  if (local_48.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.node.ptr !=
      (OwnPromiseNode)0x0) {
    local_48.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.node.ptr =
         (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.super_PromiseBase.node.ptr);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> sendStreaming() override {
    // We don't do any special handling of streaming in RequestHook for local requests, because
    // there is no latency to compensate for between the client and server in this case.  However,
    // we record whether the call was streaming, so that it can be preserved as a streaming call
    // if the local capability later resolves to a remote capability.
    bool isStreaming = true;
    return sendImpl(isStreaming).ignoreResult();
  }